

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_input.c
# Opt level: O0

mpt_input * mpt_stream_input(mpt_socket *from,int mode,int code,size_t idlen)

{
  int iVar1;
  int *piVar2;
  mpt_streamInput *srm;
  mpt_stream tmp;
  size_t idlen_local;
  int code_local;
  int mode_local;
  mpt_socket *from_local;
  
  tmp._wd._enc = (mpt_data_encoder_t)idlen;
  memset(&srm,0,0x98);
  tmp._rd._state.data.len = 0xffffffffffffffff;
  if (tmp._wd._enc < (mpt_data_encoder_t)0x100) {
    if (code == 0) {
      piVar2 = __errno_location();
      *piVar2 = 0x16;
      from_local = (mpt_socket *)0x0;
    }
    else {
      if ((mode & 1U) != 0) {
        if ((mode & 2U) == 0) {
          piVar2 = __errno_location();
          *piVar2 = 0x16;
          return (mpt_input *)0x0;
        }
        tmp._wd._state.scratch = mpt_message_encoder(code);
        if (tmp._wd._state.scratch == 0) {
          return (mpt_input *)0x0;
        }
      }
      tmp._rd._state.data.msg = mpt_message_decoder(code);
      if (tmp._rd._state.data.msg == 0) {
        from_local = (mpt_socket *)0x0;
      }
      else {
        iVar1 = mpt_stream_dopen((mpt_stream *)&srm,from,mode);
        if (iVar1 < 0) {
          piVar2 = __errno_location();
          *piVar2 = 0x16;
          from_local = (mpt_socket *)0x0;
        }
        else {
          from_local = (mpt_socket *)malloc((size_t)(tmp._wd._enc + 0xb8));
          if (from_local == (mpt_socket *)0x0) {
            mpt_stream_close((mpt_stream *)&srm);
            from_local = (mpt_socket *)0x0;
          }
          else {
            *(_mpt_vptr_input **)from_local = &mpt_stream_input::streamInput;
            *(undefined8 *)(from_local + 2) = 1;
            memcpy(from_local + 4,&srm,0x98);
            *(_mpt_vptr_reply_context **)(from_local + 0x2a) = &mpt_stream_input::streamContext;
            *(short *)&from_local[0x2c]._id = (short)tmp._wd._enc;
            *(undefined2 *)((long)&from_local[0x2c]._id + 2) = 0;
          }
        }
      }
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    from_local = (mpt_socket *)0x0;
  }
  return (mpt_input *)from_local;
}

Assistant:

extern MPT_INTERFACE(input) *mpt_stream_input(const MPT_STRUCT(socket) *from, int mode, int code, size_t idlen)
{
	static const MPT_INTERFACE_VPTR(input) streamInput = {
		{ { streamConv },
		  streamUnref,
		  streamRef,
		  streamClone
		},
		streamNext,
		streamDispatch
	};
	static const MPT_INTERFACE_VPTR(reply_context) streamContext = {
		streamReply,
		streamDefer
	};
	MPT_STRUCT(stream) tmp = MPT_STREAM_INIT;
	MPT_STRUCT(streamInput) *srm;
	
	/* id size limit exceeded */
	if (idlen > UINT8_MAX) {
		errno = EINVAL;
		return 0;
	}
	/* id requires message format on stream */
	if (!code) {
		errno = EINVAL;
		return 0;
	}
	/* bidirectional mode for reply */
	if (mode & MPT_STREAMFLAG(Write)) {
		if (!(mode & MPT_STREAMFLAG(RdWr))) {
			errno = EINVAL;
			return 0;
		}
		if (!(tmp._wd._enc = mpt_message_encoder(code))) {
			return 0;
		}
	}
	/* input codec for message */
	if (!(tmp._rd._dec = mpt_message_decoder(code))) {
		return 0;
	}
	/* set temporary data, no resource leakage on error */
	if (mpt_stream_dopen(&tmp, from, mode) < 0) {
		errno = EINVAL;
		return 0;
	}
	if (!(srm = malloc(sizeof(*srm) + idlen))) {
		mpt_stream_close(&tmp);
		return 0;
	}
	srm->_in._vptr = &streamInput;
	srm->ref._val = 1;
	
	srm->data = tmp;
	
	srm->_rc._vptr = &streamContext;
	srm->rd._max = idlen;
	srm->rd.len = 0;
	
	return &srm->_in;
}